

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O0

void __thiscall
TileData::TileData(TileData *this,t id,t state1,t state2,t dir,bool highlight,uint16_t meta)

{
  bool highlight_local;
  t dir_local;
  t state2_local;
  t state1_local;
  t id_local;
  TileData *this_local;
  
  *this = (TileData)((uint)*this & 0xffffffe0 | id & 0x1f);
  *this = (TileData)((uint)*this & 0xfffffcff | (state1 & 3) << 8);
  *this = (TileData)((uint)*this & 0xfffff3ff | (state2 & 3) << 10);
  *this = (TileData)((uint)*this & 0xffffcfff | (dir & 3) << 0xc);
  *this = (TileData)((uint)*this & 0xffffbfff | (uint)highlight << 0xe);
  *this = (TileData)((uint)*this & 0xffff | (uint)meta << 0x10);
  return;
}

Assistant:

TileData::TileData(TileId::t id, State::t state1, State::t state2, Direction::t dir, bool highlight, uint16_t meta) :
    id(id),
    state1(state1),
    state2(state2),
    dir(dir),
    highlight(highlight),
    meta(meta) {
}